

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_drawPolySeg(FPolySeg *seg,AMColor *color)

{
  mline_t local_38;
  
  local_38.a.x = (seg->v1).pos.X;
  local_38.a.y = (seg->v1).pos.Y;
  local_38.b.x = (seg->v2).pos.X;
  local_38.b.y = (seg->v2).pos.Y;
  if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive)))) {
    AM_rotatePoint((double *)&local_38,&local_38.a.y);
    AM_rotatePoint(&local_38.b.x,&local_38.b.y);
  }
  AM_drawMline(&local_38,color);
  return;
}

Assistant:

void AM_drawPolySeg(FPolySeg *seg, const AMColor &color)
{
	mline_t l;
	l.a.x = seg->v1.pos.X;
	l.a.y = seg->v1.pos.Y;
	l.b.x = seg->v2.pos.X;
	l.b.y = seg->v2.pos.Y;

	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotatePoint (&l.a.x, &l.a.y);
		AM_rotatePoint (&l.b.x, &l.b.y);
	}
	AM_drawMline(&l, color);
}